

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

optional<long> __thiscall wasm::WATParser::anon_unknown_11::ParseInput::takeI64(ParseInput *this)

{
  _Storage<unsigned_long,_true> unaff_RBX;
  ulong uVar1;
  optional<unsigned_long> oVar2;
  optional<long> oVar3;
  Token local_68;
  char local_28;
  
  if (((this->lexer).curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
       super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
       super__Optional_payload_base<wasm::WATParser::Token>._M_engaged == true) &&
     ((this->lexer).index != 0)) {
    local_68.span._M_len =
         (this->lexer).curr.super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
         super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
         super__Optional_payload_base<wasm::WATParser::Token>._M_payload._M_value.span._M_len;
    local_68.span._M_str =
         *(char **)((long)&(this->lexer).curr.
                           super__Optional_base<wasm::WATParser::Token,_false,_false>._M_payload.
                           super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>.
                           super__Optional_payload_base<wasm::WATParser::Token>._M_payload + 8);
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)&local_68.data,
                      (_Copy_ctor_base<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                       *)((long)&(this->lexer).curr.
                                 super__Optional_base<wasm::WATParser::Token,_false,_false>.
                                 _M_payload.
                                 super__Optional_payload<wasm::WATParser::Token,_true,_false,_false>
                                 .super__Optional_payload_base<wasm::WATParser::Token>._M_payload +
                         0x10));
    local_28 = '\x01';
    oVar2 = Token::getI64(&local_68);
    if (((undefined1  [16])
         oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      Lexer::skipSpace(&this->lexer);
      Lexer::lexToken(&this->lexer);
      uVar1 = CONCAT71((int7)((ulong)&local_68.data >> 8),1);
      unaff_RBX._M_value =
           oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      goto LAB_00a0ea71;
    }
  }
  else {
    local_28 = '\0';
  }
  uVar1 = 0;
LAB_00a0ea71:
  if (local_28 == '\x01') {
    local_28 = 0;
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
    ::~_Variant_storage((_Variant_storage<false,_wasm::WATParser::LParenTok,_wasm::WATParser::RParenTok,_wasm::WATParser::IdTok,_wasm::WATParser::IntTok,_wasm::WATParser::FloatTok,_wasm::WATParser::StringTok,_wasm::WATParser::KeywordTok>
                         *)&local_68.data);
  }
  oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       uVar1 & 0xffffffff;
  oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = unaff_RBX._M_value;
  return (optional<long>)
         oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<int64_t> takeI64() {
    if (auto t = peek()) {
      if (auto n = t->getI64()) {
        ++lexer;
        return n;
      }
    }
    return {};
  }